

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test::
~TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test
          (TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test *this)

{
  TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test *this_local;
  
  ~TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallDoesntInfluenceExpectOneCall)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    expectations.addFunction("influence")->callWasMade(1);
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().expectOneCall("influence");
    mock().actualCall("influence");
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}